

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOSExe.cpp
# Opt level: O3

void __thiscall DOSExe::wrap(DOSExe *this)

{
  short sVar1;
  mapped_type pEVar2;
  int iVar3;
  int iVar4;
  ExeElementWrapper *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *ppEVar5;
  ExeException *pEVar6;
  QString QStack_68;
  QString local_50;
  QString local_38;
  key_type local_20;
  
  this_00 = (ExeElementWrapper *)operator_new(0x10);
  ExeElementWrapper::ExeElementWrapper(this_00,(Executable *)this);
  (this_00->super_AbstractByteBuffer)._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__AbstractByteBuffer_00157c10;
  this->dosHdrWrapper = (DosHdrWrapper *)this_00;
  iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[7])(this,0,0x40,0);
  this->m_dosHdr = (IMAGE_DOS_HEADER *)CONCAT44(extraout_var,iVar3);
  if ((IMAGE_DOS_HEADER *)CONCAT44(extraout_var,iVar3) == (IMAGE_DOS_HEADER *)0x0) {
    pEVar6 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_38,"Could not Wrap!");
    ExeException::ExeException(pEVar6,&local_38);
    __cxa_throw(pEVar6,&ExeException::typeinfo,CustomException::~CustomException);
  }
  iVar3 = (*(this->dosHdrWrapper->super_ExeElementWrapper).super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0x12])(this->dosHdrWrapper,0,0xffffffffffffffff);
  iVar4 = (*(this->dosHdrWrapper->super_ExeElementWrapper).super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  if (((short *)CONCAT44(extraout_var_00,iVar3) != (short *)0x0) &&
     (CONCAT44(extraout_var_01,iVar4) != 0)) {
    sVar1 = *(short *)CONCAT44(extraout_var_00,iVar3);
    if ((sVar1 != 0x4d5a) && (sVar1 != 0x5a4d)) {
      Logger::append(D_WARNING,"It is not a DOS file!\n");
      pEVar6 = (ExeException *)__cxa_allocate_exception(0x48);
      QString::QString(&QStack_68,"It is not a DOS file!");
      ExeException::ExeException(pEVar6,&QStack_68);
      __cxa_throw(pEVar6,&ExeException::typeinfo,CustomException::~CustomException);
    }
    pEVar2 = &this->dosHdrWrapper->super_ExeElementWrapper;
    local_20 = 0;
    ppEVar5 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,&local_20);
    *ppEVar5 = pEVar2;
    return;
  }
  pEVar6 = (ExeException *)__cxa_allocate_exception(0x48);
  QString::QString(&local_50,"Could not Wrap!");
  ExeException::ExeException(pEVar6,&local_50);
  __cxa_throw(pEVar6,&ExeException::typeinfo,CustomException::~CustomException);
}

Assistant:

void DOSExe::wrap()
{
    this->dosHdrWrapper = new DosHdrWrapper(this);

    m_dosHdr = (IMAGE_DOS_HEADER*) getContentAt(0, sizeof(IMAGE_DOS_HEADER));
    if (m_dosHdr == NULL) throw ExeException("Could not Wrap!");

    WORD* magic = (WORD*) this->dosHdrWrapper->getFieldPtr(DosHdrWrapper::MAGIC);

    if (this->dosHdrWrapper->getPtr() == NULL || magic == NULL) {
        throw ExeException("Could not Wrap!");
    }

    if ((*magic) != pe::S_DOS && (*magic) != pe::S_DOS2) {
        Logger::append(Logger::D_WARNING, "It is not a DOS file!\n");
        throw ExeException("It is not a DOS file!");
    }
    this->wrappers[WR_DOS_HDR] = this->dosHdrWrapper;
}